

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O0

void * __thiscall CHeap::Allocate(CHeap *this,uint Size)

{
  uint in_ESI;
  CHeap *in_RDI;
  char *pMem;
  undefined8 local_18;
  undefined4 in_stack_fffffffffffffff0;
  
  local_18 = AllocateFromChunk(in_RDI,in_ESI);
  if (local_18 == (void *)0x0) {
    NewChunk((CHeap *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    local_18 = AllocateFromChunk(in_RDI,in_ESI);
  }
  return local_18;
}

Assistant:

void *CHeap::Allocate(unsigned int Size)
{
	// try to allocate from current chunk
	char *pMem = (char *)AllocateFromChunk(Size);
	if(!pMem)
	{
		// allocate new chunk and add it to the heap
		NewChunk();

		// try to allocate again
		pMem = (char *)AllocateFromChunk(Size);
	}

	return pMem;
}